

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu.h
# Opt level: O1

uint32_t __thiscall
basist::ktx2_transcoder::get_etc1s_image_descs_image_flags
          (ktx2_transcoder *this,uint32_t level_index,uint32_t layer_index,uint32_t face_index)

{
  int iVar1;
  uint uVar2;
  
  iVar1 = *(int *)(this->m_header).m_layer_count.m_bytes;
  uVar2 = ((iVar1 + (uint)(iVar1 == 0)) * level_index + layer_index) *
          *(int *)(this->m_header).m_face_count.m_bytes + face_index;
  if (uVar2 < (this->m_etc1s_image_descs).m_size) {
    return *(uint32_t *)(this->m_etc1s_image_descs).m_p[uVar2].m_image_flags.m_bytes;
  }
  __assert_fail("0",
                "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/transcoder/basisu_transcoder.cpp"
                ,0x4220,
                "uint32_t basist::ktx2_transcoder::get_etc1s_image_descs_image_flags(uint32_t, uint32_t, uint32_t) const"
               );
}

Assistant:

static inline uint32_t read_le_dword(const uint8_t *pBytes)
	{
		return (pBytes[3] << 24U) | (pBytes[2] << 16U) | (pBytes[1] << 8U) | (pBytes[0]);
	}